

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O1

int ReduceEsopCover(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  
  iVar19 = 0;
  uVar18 = 0;
  do {
    if (g_CoverInfo.Verbosity == 1) {
      putchar(0x2e);
    }
    else if (g_CoverInfo.Verbosity == 2) {
      uVar18 = uVar18 + 1;
      printf("\nITERATION #%d\n\n",(ulong)uVar18);
    }
    iVar1 = IterativelyApplyExorLink2('\x03');
    iVar2 = IterativelyApplyExorLink3('\x03');
    iVar3 = IterativelyApplyExorLink2('\x03');
    iVar4 = IterativelyApplyExorLink3('\x03');
    iVar5 = IterativelyApplyExorLink2('\x03');
    iVar6 = IterativelyApplyExorLink3('\x03');
    iVar7 = IterativelyApplyExorLink2('\x03');
    iVar8 = IterativelyApplyExorLink3('\x03');
    iVar9 = IterativelyApplyExorLink2('\x03');
    iVar10 = IterativelyApplyExorLink3('\x03');
    iVar11 = IterativelyApplyExorLink2('\x03');
    iVar12 = IterativelyApplyExorLink3('\x03');
    iVar12 = iVar12 + iVar11 + iVar10 + iVar9 + iVar8 +
                      iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
    if ((int)(uint)(0 < g_CoverInfo.Quality) < iVar19) {
      iVar1 = IterativelyApplyExorLink2('\x03');
      iVar2 = IterativelyApplyExorLink3('\x03');
      iVar3 = IterativelyApplyExorLink2('\a');
      iVar4 = IterativelyApplyExorLink3('\a');
      iVar5 = IterativelyApplyExorLink2('\a');
      iVar6 = IterativelyApplyExorLink4('\a');
      iVar7 = IterativelyApplyExorLink2('\a');
      iVar8 = IterativelyApplyExorLink4('\x03');
      iVar9 = IterativelyApplyExorLink2('\x03');
      iVar10 = IterativelyApplyExorLink3('\x03');
      iVar11 = IterativelyApplyExorLink2('\a');
      iVar13 = IterativelyApplyExorLink3('\a');
      iVar14 = IterativelyApplyExorLink2('\a');
      iVar15 = IterativelyApplyExorLink4('\a');
      iVar16 = IterativelyApplyExorLink2('\a');
      iVar17 = IterativelyApplyExorLink4('\x03');
      iVar12 = iVar17 + iVar16 + iVar15 +
               iVar14 + iVar13 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 +
               iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1 + iVar12;
    }
    iVar19 = iVar19 + 1;
    if (iVar12 != 0) {
      iVar19 = 0;
    }
  } while (iVar19 <= g_CoverInfo.Quality);
  s_fDecreaseLiterals = 1;
  if (g_CoverInfo.Verbosity == 1) {
    putchar(0x2e);
  }
  else if (g_CoverInfo.Verbosity == 2) {
    printf("\nITERATION #%d\n\n",(ulong)(uVar18 + 1));
  }
  IterativelyApplyExorLink2('\x03');
  IterativelyApplyExorLink3('\x03');
  IterativelyApplyExorLink2('\x03');
  IterativelyApplyExorLink3('\x03');
  IterativelyApplyExorLink2('\x03');
  IterativelyApplyExorLink3('\x03');
  IterativelyApplyExorLink2('\x03');
  IterativelyApplyExorLink3('\x03');
  IterativelyApplyExorLink2('\x03');
  IterativelyApplyExorLink3('\x03');
  if (g_CoverInfo.nCubesFree + g_CoverInfo.nCubesInUse == g_CoverInfo.nCubesAlloc) {
    return 0;
  }
  __assert_fail("g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exor.c"
                ,0xca,"int ReduceEsopCover()");
}

Assistant:

int ReduceEsopCover()
{
    ///////////////////////////////////////////////////////////////
    // SIMPLIFICATION
    ////////////////////////////////////////////////////////////////////

    int nIterWithoutImprovement = 0;
    int nIterCount = 0;
    int GainTotal;
    int z;

    do
    {
//START:
        if ( g_CoverInfo.Verbosity == 2 )
            printf( "\nITERATION #%d\n\n", ++nIterCount );
        else if ( g_CoverInfo.Verbosity == 1 )
            printf( "." );

        GainTotal  = 0;
        GainTotal += IterativelyApplyExorLink2( 1|2|0 );
        GainTotal += IterativelyApplyExorLink3( 1|2|0 );

        GainTotal += IterativelyApplyExorLink2( 1|2|0 );
        GainTotal += IterativelyApplyExorLink3( 1|2|0 );

        GainTotal += IterativelyApplyExorLink2( 1|2|0 );
        GainTotal += IterativelyApplyExorLink3( 1|2|0 );

        GainTotal += IterativelyApplyExorLink2( 1|2|0 );
        GainTotal += IterativelyApplyExorLink3( 1|2|0 );

        GainTotal += IterativelyApplyExorLink2( 1|2|0 );
        GainTotal += IterativelyApplyExorLink3( 1|2|0 );

        GainTotal += IterativelyApplyExorLink2( 1|2|0 );
        GainTotal += IterativelyApplyExorLink3( 1|2|0 );

        if ( nIterWithoutImprovement > (int)(g_CoverInfo.Quality>0) )
        {
            GainTotal += IterativelyApplyExorLink2( 1|2|0 );
            GainTotal += IterativelyApplyExorLink3( 1|2|0 );
            GainTotal += IterativelyApplyExorLink2( 1|2|4 );
            GainTotal += IterativelyApplyExorLink3( 1|2|4 );
            GainTotal += IterativelyApplyExorLink2( 1|2|4 );
            GainTotal += IterativelyApplyExorLink4( 1|2|4 );
            GainTotal += IterativelyApplyExorLink2( 1|2|4 );
            GainTotal += IterativelyApplyExorLink4( 1|2|0 );

            GainTotal += IterativelyApplyExorLink2( 1|2|0 );
            GainTotal += IterativelyApplyExorLink3( 1|2|0 );
            GainTotal += IterativelyApplyExorLink2( 1|2|4 );
            GainTotal += IterativelyApplyExorLink3( 1|2|4 );
            GainTotal += IterativelyApplyExorLink2( 1|2|4 );
            GainTotal += IterativelyApplyExorLink4( 1|2|4 );
            GainTotal += IterativelyApplyExorLink2( 1|2|4 );
            GainTotal += IterativelyApplyExorLink4( 1|2|0 );
        }

        if ( GainTotal )
            nIterWithoutImprovement = 0;
        else
            nIterWithoutImprovement++;

//      if ( g_CoverInfo.Quality >= 2 && nIterWithoutImprovement == 2 )
//          s_fDecreaseLiterals = 1;
    }
    while ( nIterWithoutImprovement < 1 + g_CoverInfo.Quality );


    // improve the literal count
    s_fDecreaseLiterals = 1;
    for ( z = 0; z < 1; z++ )
    {
        if ( g_CoverInfo.Verbosity == 2 )
            printf( "\nITERATION #%d\n\n", ++nIterCount );
        else if ( g_CoverInfo.Verbosity == 1 )
            printf( "." );

        GainTotal  = 0;
        GainTotal += IterativelyApplyExorLink2( 1|2|0 );
        GainTotal += IterativelyApplyExorLink3( 1|2|0 );

        GainTotal += IterativelyApplyExorLink2( 1|2|0 );
        GainTotal += IterativelyApplyExorLink3( 1|2|0 );

        GainTotal += IterativelyApplyExorLink2( 1|2|0 );
        GainTotal += IterativelyApplyExorLink3( 1|2|0 );

        GainTotal += IterativelyApplyExorLink2( 1|2|0 );
        GainTotal += IterativelyApplyExorLink3( 1|2|0 );

        GainTotal += IterativelyApplyExorLink2( 1|2|0 );
        GainTotal += IterativelyApplyExorLink3( 1|2|0 );

//      if ( GainTotal )
//      {
//          nIterWithoutImprovement = 0;
//          goto START;
//      }           
    }


/*  ////////////////////////////////////////////////////////////////////
    // Print statistics
    printf( "\nShallow simplification time is ";
    cout << (float)(clk2 - clk1)/(float)(CLOCKS_PER_SEC) << " sec\n" );
    printf( "Deep simplification time is ";
    cout << (float)(Abc_Clock() - clk2)/(float)(CLOCKS_PER_SEC) << " sec\n" );
    printf( "Cover after iterative simplification = " << s_nCubesInUse << endl;
    printf( "Reduced by initial cube writing      = " << g_CoverInfo.nCubesBefore-nCubesAfterWriting << endl;
    printf( "Reduced by shallow simplification    = " << nCubesAfterWriting-nCubesAfterShallow << endl;
    printf( "Reduced by deep simplification       = " << nCubesAfterWriting-s_nCubesInUse << endl;

//  printf( "\nThe total number of cubes created = " << g_CoverInfo.cIDs << endl;
//  printf( "Total number of places in a queque = " << s_nPosAlloc << endl;
//  printf( "Minimum free places in queque-2 = " << s_nPosMax[0] << endl;
//  printf( "Minimum free places in queque-3 = " << s_nPosMax[1] << endl;
//  printf( "Minimum free places in queque-4 = " << s_nPosMax[2] << endl;
*/  ////////////////////////////////////////////////////////////////////

    // write the number of cubes into cover information 
    assert ( g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc );

//  printf( "\nThe output cover is\n" );
//  PrintCoverDebug( cout );

    return 0;
}